

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O2

string * XmlRpc::XmlRpcUtil::xmlDecode(string *__return_storage_ptr__,string *encoded)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  char cVar8;
  char **ppcVar9;
  
  uVar6 = std::__cxx11::string::find((char)encoded,0x26);
  if (uVar6 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)encoded);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)encoded,0,uVar6);
    uVar3 = encoded->_M_string_length;
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    pcVar4 = (encoded->_M_dataplus)._M_p;
LAB_0028860e:
    if (uVar6 != uVar3) {
      uVar1 = uVar6 + 1;
      cVar8 = (char)__return_storage_ptr__;
      if (uVar1 < uVar3 && (encoded->_M_dataplus)._M_p[uVar6] == '&') {
        ppcVar9 = xmlEntity;
        lVar7 = 0;
        do {
          if (lVar7 == 0x14) {
            std::__cxx11::string::push_back(cVar8);
            uVar6 = uVar1;
            goto LAB_0028860e;
          }
          iVar2 = *(int *)((long)xmlEntLen + lVar7);
          iVar5 = strncmp(pcVar4 + uVar6 + 1,*ppcVar9,(long)iVar2);
          lVar7 = lVar7 + 4;
          ppcVar9 = ppcVar9 + 1;
        } while (iVar5 != 0);
        std::__cxx11::string::push_back(cVar8);
        uVar6 = uVar6 + (long)iVar2 + 1;
      }
      else {
        std::__cxx11::string::push_back(cVar8);
        uVar6 = uVar1;
      }
      goto LAB_0028860e;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string 
XmlRpcUtil::xmlDecode(const std::string& encoded)
{
  std::string::size_type iAmp = encoded.find(AMP);
  if (iAmp == std::string::npos)
    return encoded;

  std::string decoded(encoded, 0, iAmp);
  std::string::size_type iSize = encoded.size();
  decoded.reserve(iSize);

  const char* ens = encoded.c_str();
  while (iAmp != iSize) {
    if (encoded[iAmp] == AMP && iAmp+1 < iSize) {
      int iEntity;
      for (iEntity=0; xmlEntity[iEntity] != 0; ++iEntity)
	//if (encoded.compare(iAmp+1, xmlEntLen[iEntity], xmlEntity[iEntity]) == 0)
	if (strncmp(ens+iAmp+1, xmlEntity[iEntity], xmlEntLen[iEntity]) == 0)
        {
          decoded += rawEntity[iEntity];
          iAmp += xmlEntLen[iEntity]+1;
          break;
        }
      if (xmlEntity[iEntity] == 0)    // unrecognized sequence
        decoded += encoded[iAmp++];

    } else {
      decoded += encoded[iAmp++];
    }
  }
    
  return decoded;
}